

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void PBKDF2_SHA256(uint8_t *passwd,size_t passwdlen,uint8_t *salt,size_t saltlen,uint64_t c,
                  uint8_t *buf,size_t dkLen)

{
  ulong in_R8;
  long in_R9;
  size_t clen;
  int k;
  uint64_t j;
  uint8_t T [32];
  uint8_t U [32];
  uint8_t ivec [4];
  size_t i;
  HMAC_SHA256_CTX_Y hctx;
  HMAC_SHA256_CTX_Y PShctx;
  void *in_stack_fffffffffffffdb8;
  HMAC_SHA256_CTX_Y *in_stack_fffffffffffffdc0;
  int local_234;
  ulong local_230;
  HMAC_SHA256_CTX_Y *in_stack_fffffffffffffdd8;
  uchar *in_stack_fffffffffffffde0;
  HMAC_SHA256_CTX_Y *local_208;
  uchar *local_200;
  size_t in_stack_fffffffffffffe20;
  void *in_stack_fffffffffffffe28;
  void *_K;
  HMAC_SHA256_CTX_Y *in_stack_fffffffffffffe30;
  undefined1 local_100 [208];
  long local_30;
  ulong local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  HMAC_SHA256_Init_Y(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  HMAC_SHA256_Update_Y(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0x153cd9);
  for (_K = (void *)0x0; (ulong)((long)_K << 5) < clen; _K = (void *)((long)_K + 1)) {
    be32enc(&stack0xfffffffffffffe24,(int)_K + 1);
    memcpy(&stack0xfffffffffffffe30,local_100,0xd0);
    HMAC_SHA256_Update_Y(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0x153d39);
    HMAC_SHA256_Final_Y(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    in_stack_fffffffffffffdd8 = local_208;
    in_stack_fffffffffffffde0 = local_200;
    for (local_230 = 2; local_230 <= local_28; local_230 = local_230 + 1) {
      HMAC_SHA256_Init_Y(in_stack_fffffffffffffe30,_K,in_stack_fffffffffffffe20);
      HMAC_SHA256_Update_Y(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,0x153dba);
      HMAC_SHA256_Final_Y(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      for (local_234 = 0; local_234 < 0x20; local_234 = local_234 + 1) {
        (&stack0xfffffffffffffdd8)[local_234] =
             (&stack0xfffffffffffffdd8)[local_234] ^ *(byte *)((long)&local_208 + (long)local_234);
      }
    }
    in_stack_fffffffffffffdc0 = (HMAC_SHA256_CTX_Y *)(clen + (long)_K * -0x20);
    if ((HMAC_SHA256_CTX_Y *)0x20 < in_stack_fffffffffffffdc0) {
      in_stack_fffffffffffffdc0 = (HMAC_SHA256_CTX_Y *)0x20;
    }
    memcpy((void *)(local_30 + (long)_K * 0x20),&stack0xfffffffffffffdd8,
           (size_t)in_stack_fffffffffffffdc0);
  }
  memset(local_100,0,0xd0);
  return;
}

Assistant:

void
PBKDF2_SHA256(const uint8_t * passwd, size_t passwdlen, const uint8_t * salt,
    size_t saltlen, uint64_t c, uint8_t * buf, size_t dkLen)
{
	HMAC_SHA256_CTX_Y PShctx, hctx;
	size_t i;
	uint8_t ivec[4];
	uint8_t U[32];
	uint8_t T[32];
	uint64_t j;
	int k;
	size_t clen;

	/* Compute HMAC state after processing P and S. */
	HMAC_SHA256_Init_Y(&PShctx, passwd, passwdlen);
	HMAC_SHA256_Update_Y(&PShctx, salt, saltlen);

	/* Iterate through the blocks. */
	for (i = 0; i * 32 < dkLen; i++) {
		/* Generate INT(i + 1). */
		be32enc(ivec, (uint32_t)(i + 1));

		/* Compute U_1 = PRF(P, S || INT(i)). */
		memcpy(&hctx, &PShctx, sizeof(HMAC_SHA256_CTX_Y));
		HMAC_SHA256_Update_Y(&hctx, ivec, 4);
		HMAC_SHA256_Final_Y(U, &hctx);

		/* T_i = U_1 ... */
		memcpy(T, U, 32);

		for (j = 2; j <= c; j++) {
			/* Compute U_j. */
			HMAC_SHA256_Init_Y(&hctx, passwd, passwdlen);
			HMAC_SHA256_Update_Y(&hctx, U, 32);
			HMAC_SHA256_Final_Y(U, &hctx);

			/* ... xor U_j ... */
			for (k = 0; k < 32; k++)
				T[k] ^= U[k];
		}

		/* Copy as many bytes as necessary into buf. */
		clen = dkLen - i * 32;
		if (clen > 32)
			clen = 32;
		memcpy(&buf[i * 32], T, clen);
	}

	/* Clean PShctx, since we never called _Final on it. */
	memset(&PShctx, 0, sizeof(HMAC_SHA256_CTX_Y));
}